

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_reader.h
# Opt level: O0

string_view __thiscall
absl::lts_20250127::cord_internal::CordRepBtreeReader::Init
          (CordRepBtreeReader *this,CordRepBtree *tree)

{
  CordRep *edge_00;
  string_view sVar1;
  CordRep *edge;
  CordRepBtree *tree_local;
  CordRepBtreeReader *this_local;
  
  if (tree != (CordRepBtree *)0x0) {
    edge_00 = CordRepBtreeNavigator::InitFirst(&this->navigator_,tree);
    this->remaining_ = (tree->super_CordRep).length - edge_00->length;
    sVar1 = EdgeData(edge_00);
    return sVar1;
  }
  __assert_fail("tree != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree_reader.h"
                ,0xa8,
                "absl::string_view absl::cord_internal::CordRepBtreeReader::Init(CordRepBtree *)");
}

Assistant:

inline absl::string_view CordRepBtreeReader::Init(CordRepBtree* tree) {
  assert(tree != nullptr);
  const CordRep* edge = navigator_.InitFirst(tree);
  remaining_ = tree->length - edge->length;
  return EdgeData(edge);
}